

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void CountTracks(Node *node,uint *cnt)

{
  size_type sVar1;
  reference ppNVar2;
  uint local_1c;
  uint i;
  uint *cnt_local;
  Node *node_local;
  
  sVar1 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&node->aPositionKeys);
  if ((((1 < sVar1) ||
       (sVar1 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::size(&node->aRotationKeys),
       1 < sVar1)) ||
      (sVar1 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&node->aScalingKeys),
      1 < sVar1)) ||
     ((sVar1 = std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
               size(&node->aCameraRollKeys), 1 < sVar1 ||
      (sVar1 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                         (&node->aTargetPositionKeys), 1 < sVar1)))) {
    *cnt = *cnt + 1;
    sVar1 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size(&node->aTargetPositionKeys)
    ;
    if (1 < sVar1) {
      *cnt = *cnt + 1;
    }
  }
  for (local_1c = 0;
      sVar1 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::size
                        (&node->mChildren), local_1c < sVar1; local_1c = local_1c + 1) {
    ppNVar2 = std::vector<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>::operator[]
                        (&node->mChildren,(ulong)local_1c);
    CountTracks(*ppNVar2,cnt);
  }
  return;
}

Assistant:

void CountTracks(D3DS::Node* node, unsigned int& cnt)
{
    //////////////////////////////////////////////////////////////////////////////
    // We will never generate more than one channel for a node, so
    // this is rather easy here.

    if (node->aPositionKeys.size()  > 1  || node->aRotationKeys.size()   > 1   ||
        node->aScalingKeys.size()   > 1  || node->aCameraRollKeys.size() > 1 ||
        node->aTargetPositionKeys.size()  > 1)
    {
        ++cnt;

        // account for the additional channel for the camera/spotlight target position
        if (node->aTargetPositionKeys.size()  > 1)++cnt;
    }

    // Recursively process all children
    for (unsigned int i = 0; i < node->mChildren.size();++i)
        CountTracks(node->mChildren[i],cnt);
}